

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::Utils::Buffer::Init
          (Buffer *this,BUFFERS buffer,USAGE usage,GLsizeiptr size,GLvoid *data)

{
  GLuint GVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  Functions *gl;
  undefined4 extraout_var_00;
  
  if (this->m_id != 0xffffffff) {
    iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x438))(1,this);
    this->m_id = 0xffffffff;
  }
  this->m_buffer = buffer;
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var_00,iVar2);
  Generate(gl,&this->m_id);
  GVar1 = this->m_id;
  GVar3 = GetBufferGLenum(this->m_buffer);
  (*gl->bindBuffer)(GVar3,GVar1);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x6f7);
  Data(gl,this->m_buffer,usage,size,data);
  return;
}

Assistant:

void Buffer::Init(BUFFERS buffer, USAGE usage, GLsizeiptr size, GLvoid* data)
{
	/* Delete previous buffer instance */
	Release();

	m_buffer = buffer;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	Generate(gl, m_id);
	Bind(gl, m_id, m_buffer);
	Data(gl, m_buffer, usage, size, data);
}